

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_push_level(Parser *this,bool explicit_flow_chars)

{
  State *pSVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  flag_t fVar6;
  bool bVar7;
  NodeData *pNVar8;
  size_t sVar9;
  csubstr cVar10;
  char msg [42];
  size_t local_20;
  
  sVar9 = (this->m_stack).m_size;
  pSVar1 = this->m_state;
  if (sVar9 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '\\';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    msg._24_2_ = cVar10.str._0_2_;
    msg._26_2_ = cVar10.str._2_2_;
    msg._28_4_ = cVar10.str._4_4_;
    msg._32_2_ = (undefined2)cVar10.len;
    msg._34_6_ = cVar10.len._2_6_;
    (*(code *)PTR_error_impl_0022e4f8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar9 = (this->m_stack).m_size;
  }
  if (pSVar1 != (this->m_stack).m_stack + (sVar9 - 1)) {
    builtin_strncpy(msg + 0x20,"ck.top())",10);
    builtin_strncpy(msg + 0x10,"_state == &m_sta",0x10);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar7 = is_debugger_attached();
      if (bVar7) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_20 = cVar10.len;
    auVar5 = ZEXT1224(ZEXT412(0x771e) << 0x40);
    LVar4.name.str._0_4_ = (int)cVar10.str;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = cVar10.str._4_4_;
    LVar4.name.len = local_20;
    (*p_Var2)(msg,0x2a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar8 = node(this,this->m_state);
  if (pNVar8 != (NodeData *)0x0) {
    if ((explicit_flow_chars) || ((this->m_state->flags & 0x10) != 0)) {
      fVar6 = 0x12;
    }
    else {
      fVar6 = 2;
    }
    detail::stack<c4::yml::Parser::State,_16UL>::push_top(&this->m_stack);
    sVar9 = (this->m_stack).m_size;
    if (sVar9 == 0) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar7 = is_debugger_attached();
        if (bVar7) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      cVar10 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = '\\';
      msg[9] = '\\';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg._24_2_ = cVar10.str._0_2_;
      msg._26_2_ = cVar10.str._2_2_;
      msg._28_4_ = cVar10.str._4_4_;
      msg._32_2_ = (undefined2)cVar10.len;
      msg._34_6_ = cVar10.len._2_6_;
      (*(code *)PTR_error_impl_0022e4f8)
                ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
      sVar9 = (this->m_stack).m_size;
    }
    pSVar1 = (this->m_stack).m_stack;
    this->m_state = pSVar1 + (sVar9 - 1);
    pSVar1[sVar9 - 1].flags = fVar6;
    pSVar1[sVar9 - 1].node_id = 0xffffffffffffffff;
    pSVar1[sVar9 - 1].indref = 0xffffffffffffffff;
    pSVar1[sVar9 - 1].level = pSVar1[sVar9 - 1].level + 1;
  }
  return;
}

Assistant:

void Parser::_push_level(bool explicit_flow_chars)
{
    _c4dbgpf("pushing level! currnode={}  currlevel={} stacksize={} stackcap={}", m_state->node_id, m_state->level, m_stack.size(), m_stack.capacity());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state == &m_stack.top());
    if(node(m_state) == nullptr)
    {
        _c4dbgp("pushing level! actually no, current node is null");
        //_RYML_CB_ASSERT(m_stack.m_callbacks,  ! explicit_flow_chars);
        return;
    }
    flag_t st = RUNK;
    if(explicit_flow_chars || has_all(FLOW))
    {
        st |= FLOW;
    }
    m_stack.push_top();
    m_state = &m_stack.top();
    set_flags(st);
    m_state->node_id = (size_t)NONE;
    m_state->indref = (size_t)NONE;
    ++m_state->level;
    _c4dbgpf("pushing level: now, currlevel={}", m_state->level);
}